

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5HighlightCb(void *pContext,int tflags,char *pToken,int nToken,int iStartOff,int iEndOff)

{
  int iVar1;
  int iVar2;
  int rc;
  
  rc = 0;
  iVar2 = 0;
  if ((tflags & 1U) == 0) {
    iVar1 = *(int *)((long)pContext + 0x28);
    *(int *)((long)pContext + 0x28) = iVar1 + 1;
    if (0 < *(int *)((long)pContext + 0x30)) {
      iVar2 = *(int *)((long)pContext + 0x2c);
      if (*(int *)((long)pContext + 0x30) < iVar1 || iVar1 < iVar2) {
        return 0;
      }
      if (iVar1 == iVar2 && iVar2 != 0) {
        *(int *)((long)pContext + 0x54) = iStartOff;
      }
    }
    if (iVar1 == *(int *)((long)pContext + 0x1c)) {
      fts5HighlightAppend(&rc,(HighlightContext *)pContext,
                          (char *)((long)*(int *)((long)pContext + 0x54) +
                                  *(long *)((long)pContext + 0x48)),
                          iStartOff - *(int *)((long)pContext + 0x54));
      fts5HighlightAppend(&rc,(HighlightContext *)pContext,*(char **)((long)pContext + 0x38),-1);
      *(int *)((long)pContext + 0x54) = iStartOff;
    }
    if (iVar1 == *(int *)((long)pContext + 0x20)) {
      if ((*(int *)((long)pContext + 0x30) != 0) &&
         (*(int *)((long)pContext + 0x1c) < *(int *)((long)pContext + 0x2c))) {
        fts5HighlightAppend(&rc,(HighlightContext *)pContext,*(char **)((long)pContext + 0x38),-1);
      }
      fts5HighlightAppend(&rc,(HighlightContext *)pContext,
                          (char *)((long)*(int *)((long)pContext + 0x54) +
                                  *(long *)((long)pContext + 0x48)),
                          iEndOff - *(int *)((long)pContext + 0x54));
      fts5HighlightAppend(&rc,(HighlightContext *)pContext,*(char **)((long)pContext + 0x40),-1);
      *(int *)((long)pContext + 0x54) = iEndOff;
      if (rc == 0) {
        rc = fts5CInstIterNext((CInstIter *)pContext);
      }
    }
    iVar2 = rc;
    if (iVar1 == *(int *)((long)pContext + 0x30) && 0 < *(int *)((long)pContext + 0x30)) {
      fts5HighlightAppend(&rc,(HighlightContext *)pContext,
                          (char *)((long)*(int *)((long)pContext + 0x54) +
                                  *(long *)((long)pContext + 0x48)),
                          iEndOff - *(int *)((long)pContext + 0x54));
      *(int *)((long)pContext + 0x54) = iEndOff;
      iVar2 = rc;
      if ((*(int *)((long)pContext + 0x1c) <= iVar1) && (iVar1 < *(int *)((long)pContext + 0x20))) {
        fts5HighlightAppend(&rc,(HighlightContext *)pContext,*(char **)((long)pContext + 0x40),-1);
        iVar2 = rc;
      }
    }
  }
  return iVar2;
}

Assistant:

static int fts5HighlightCb(
  void *pContext,                 /* Pointer to HighlightContext object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iStartOff,                  /* Start offset of token */
  int iEndOff                     /* End offset of token */
){
  HighlightContext *p = (HighlightContext*)pContext;
  int rc = SQLITE_OK;
  int iPos;

  UNUSED_PARAM2(pToken, nToken);

  if( tflags & FTS5_TOKEN_COLOCATED ) return SQLITE_OK;
  iPos = p->iPos++;

  if( p->iRangeEnd>0 ){
    if( iPos<p->iRangeStart || iPos>p->iRangeEnd ) return SQLITE_OK;
    if( p->iRangeStart && iPos==p->iRangeStart ) p->iOff = iStartOff;
  }

  if( iPos==p->iter.iStart ){
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iStartOff - p->iOff);
    fts5HighlightAppend(&rc, p, p->zOpen, -1);
    p->iOff = iStartOff;
  }

  if( iPos==p->iter.iEnd ){
    if( p->iRangeEnd && p->iter.iStart<p->iRangeStart ){
      fts5HighlightAppend(&rc, p, p->zOpen, -1);
    }
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
    fts5HighlightAppend(&rc, p, p->zClose, -1);
    p->iOff = iEndOff;
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterNext(&p->iter);
    }
  }

  if( p->iRangeEnd>0 && iPos==p->iRangeEnd ){
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
    p->iOff = iEndOff;
    if( iPos>=p->iter.iStart && iPos<p->iter.iEnd ){
      fts5HighlightAppend(&rc, p, p->zClose, -1);
    }
  }

  return rc;
}